

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlNewNode(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlNodePtr node_00;
  xmlNodePtr node;
  xmlChar *name;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"s:xmlNewNode",&node);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    node_00 = (xmlNodePtr)xmlNewNode(0,node);
    if (node_00 == (xmlNodePtr)0x0) {
      _Py_INCREF((PyObject *)&_Py_NoneStruct);
      self_local = (PyObject *)&_Py_NoneStruct;
    }
    else {
      self_local = libxml_xmlNodePtrWrap(node_00);
    }
  }
  return self_local;
}

Assistant:

PyObject *
libxml_xmlNewNode(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *py_retval;
    xmlChar *name;
    xmlNodePtr node;

    if (!PyArg_ParseTuple(args, (char *) "s:xmlNewNode", &name))
        return (NULL);
    node = (xmlNodePtr) xmlNewNode(NULL, name);

    if (node == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    py_retval = libxml_xmlNodePtrWrap(node);
    return (py_retval);
}